

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QHash<int,_QVariant> __thiscall
QList<QHash<int,_QVariant>_>::value(QList<QHash<int,_QVariant>_> *this,qsizetype i)

{
  parameter_type in_RDX;
  long in_FS_OFFSET;
  QHash<int,_QVariant> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (Data *)0x0;
  value(this,i,in_RDX);
  QHash<int,_QVariant>::~QHash(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QHash<int,_QVariant>)(Data *)this;
  }
  __stack_chk_fail();
}

Assistant:

T value(qsizetype i) const { return value(i, T()); }